

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O2

Nwk_Obj_t * Nwk_ManCreateObj(Nwk_Man_t *p,int nFanins,int nFanouts)

{
  Vec_Ptr_t *p_00;
  Nwk_Obj_t *Entry;
  
  Entry = (Nwk_Obj_t *)
          Aig_MmFlexEntryFetch(p->pMemObjs,(p->nFanioPlus + nFanins + nFanouts) * 8 + 0x50);
  Entry->pMan = (Nwk_Man_t *)0x0;
  Entry->pFunc = (Hop_Obj_t *)0x0;
  Entry->pCopy = (void *)0x0;
  (Entry->field_3).pNext = (void *)0x0;
  *(undefined8 *)&Entry->field_0x20 = 0;
  Entry->TravId = 0;
  Entry->Level = 0;
  Entry->tArrival = 0.0;
  Entry->tRequired = 0.0;
  Entry->tSlack = 0.0;
  Entry->nFanins = 0;
  Entry->nFanouts = 0;
  Entry->nFanioAlloc = 0;
  Entry->pFanio = (Nwk_Obj_t **)(Entry + 1);
  p_00 = p->vObjs;
  Entry->Id = p_00->nSize;
  Vec_PtrPush(p_00,Entry);
  Entry->pMan = p;
  Entry->nFanioAlloc = nFanins + nFanouts + p->nFanioPlus;
  return Entry;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates an object.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Obj_t * Nwk_ManCreateObj( Nwk_Man_t * p, int nFanins, int nFanouts )
{
    Nwk_Obj_t * pObj;
    pObj = (Nwk_Obj_t *)Aig_MmFlexEntryFetch( p->pMemObjs, sizeof(Nwk_Obj_t) + (nFanins + nFanouts + p->nFanioPlus) * sizeof(Nwk_Obj_t *) );
    memset( pObj, 0, sizeof(Nwk_Obj_t) );
    pObj->pFanio = (Nwk_Obj_t **)((char *)pObj + sizeof(Nwk_Obj_t));
    pObj->Id = Vec_PtrSize( p->vObjs );
    Vec_PtrPush( p->vObjs, pObj );
    pObj->pMan        = p;
    pObj->nFanioAlloc = nFanins + nFanouts + p->nFanioPlus;
    return pObj;
}